

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cc_helper.c
# Opt level: O1

uint32_t compute_all_tadd(CPUSPARCState_conflict2 *env)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  uVar1 = (uint)env->cc_dst;
  uVar4 = 0x400000;
  if (uVar1 != 0) {
    uVar4 = uVar1 >> 8 & 0x800000;
  }
  uVar2 = (uint)env->cc_src;
  uVar3 = (uint)env->cc_src2;
  return (uint)(((uVar3 | uVar2) & 3) != 0) << 0x15 | (uint)(uVar1 < uVar2) << 0x14 | uVar4 |
         ((uVar1 ^ uVar2) & ~(uVar3 ^ uVar2)) >> 10 & 0x200000;
}

Assistant:

static uint32_t compute_all_tadd(CPUSPARCState *env)
{
    uint32_t ret;

    ret = get_NZ_icc(CC_DST);
    ret |= get_C_add_icc(CC_DST, CC_SRC);
    ret |= get_V_add_icc(CC_DST, CC_SRC, CC_SRC2);
    ret |= get_V_tag_icc(CC_SRC, CC_SRC2);
    return ret;
}